

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O1

Float __thiscall pbrt::RGBSigmoidPolynomial::MaxValue(RGBSigmoidPolynomial *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ushort uVar3;
  float *__result;
  float *pfVar4;
  long lVar5;
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  float local_1c [3];
  
  fVar7 = this->c0;
  if (fVar7 < 0.0) {
    auVar6._8_4_ = 0x80000000;
    auVar6._0_8_ = 0x8000000080000000;
    auVar6._12_4_ = 0x80000000;
    auVar6 = vxorps_avx512vl(ZEXT416((uint)this->c1),auVar6);
    auVar9._0_4_ = auVar6._0_4_ / (fVar7 + fVar7);
    auVar9._4_12_ = auVar6._4_12_;
    uVar1 = vcmpps_avx512vl(auVar9,SUB6416(ZEXT464(0x444f8000),0),6);
    fVar8 = 360.0;
    uVar2 = vcmpps_avx512vl(SUB6416(ZEXT464(0x43b40000),0),auVar9,6);
    uVar3 = (ushort)uVar2 | (ushort)uVar1;
    if ((uVar3 & 1) == 0) {
      auVar6 = vfmadd213ss_fma(ZEXT416((uint)fVar7),auVar9,ZEXT416((uint)this->c1));
      auVar6 = vfmadd213ss_fma(auVar6,auVar9,ZEXT416((uint)this->c2));
      if ((auVar6._0_4_ & 0x7fffffff) == 0x7f800000) {
        uVar1 = vcmpss_avx512f(ZEXT816(0),auVar6,1);
        local_1c[0] = (float)((uint)((byte)uVar1 & 1) * 0x3f800000);
      }
      else {
        auVar9 = vfmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar6,auVar6);
        if (auVar9._0_4_ < 0.0) {
          fVar7 = sqrtf(auVar9._0_4_);
          auVar6 = ZEXT416(auVar6._0_4_);
        }
        else {
          auVar9 = vsqrtss_avx(auVar9,auVar9);
          fVar7 = auVar9._0_4_;
        }
        local_1c[0] = auVar6._0_4_ / (fVar7 + fVar7) + 0.5;
      }
      auVar6 = vfmadd213ss_fma(ZEXT416((uint)this->c0),SUB6416(ZEXT464(0x43b40000),0),
                               ZEXT416((uint)this->c1));
      auVar6 = vfmadd213ss_fma(auVar6,SUB6416(ZEXT464(0x43b40000),0),ZEXT416((uint)this->c2));
      if ((auVar6._0_4_ & 0x7fffffff) == 0x7f800000) {
        uVar1 = vcmpss_avx512f(ZEXT816(0),auVar6,1);
        local_1c[1] = (float)((uint)((byte)uVar1 & 1) * 0x3f800000);
      }
      else {
        auVar9 = vfmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar6,auVar6);
        if (auVar9._0_4_ < 0.0) {
          fVar7 = sqrtf(auVar9._0_4_);
          auVar6 = ZEXT416(auVar6._0_4_);
        }
        else {
          auVar9 = vsqrtss_avx(auVar9,auVar9);
          fVar7 = auVar9._0_4_;
        }
        local_1c[1] = auVar6._0_4_ / (fVar7 + fVar7) + 0.5;
      }
      auVar6 = vfmadd213ss_fma(ZEXT416((uint)this->c0),SUB6416(ZEXT464(0x444f8000),0),
                               ZEXT416((uint)this->c1));
      auVar6 = vfmadd213ss_fma(auVar6,SUB6416(ZEXT464(0x444f8000),0),ZEXT416((uint)this->c2));
      if ((auVar6._0_4_ & 0x7fffffff) == 0x7f800000) {
        uVar1 = vcmpss_avx512f(ZEXT816(0),auVar6,1);
        local_1c[2] = (float)((uint)((byte)uVar1 & 1) * 0x3f800000);
      }
      else {
        auVar9 = vfmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar6,auVar6);
        if (auVar9._0_4_ < 0.0) {
          fVar7 = sqrtf(auVar9._0_4_);
          auVar6 = ZEXT416(auVar6._0_4_);
        }
        else {
          auVar9 = vsqrtss_avx(auVar9,auVar9);
          fVar7 = auVar9._0_4_;
        }
        local_1c[2] = auVar6._0_4_ / (fVar7 + fVar7) + 0.5;
      }
      pfVar4 = local_1c;
      lVar5 = 4;
      do {
        if (*pfVar4 < *(float *)((long)local_1c + lVar5)) {
          pfVar4 = (float *)((long)local_1c + lVar5);
        }
        lVar5 = lVar5 + 4;
      } while (lVar5 != 0xc);
      fVar8 = *pfVar4;
    }
    if ((uVar3 & 1) == 0) {
      return fVar8;
    }
  }
  auVar6 = vfmadd213ss_fma(ZEXT416((uint)this->c0),SUB6416(ZEXT464(0x43b40000),0),
                           ZEXT416((uint)this->c1));
  auVar6 = vfmadd213ss_fma(auVar6,SUB6416(ZEXT464(0x43b40000),0),ZEXT416((uint)this->c2));
  if ((auVar6._0_4_ & 0x7fffffff) == 0x7f800000) {
    uVar1 = vcmpss_avx512f(ZEXT816(0),auVar6,1);
    fVar7 = (float)((uint)((byte)uVar1 & 1) * 0x3f800000);
  }
  else {
    auVar9 = vfmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar6,auVar6);
    if (auVar9._0_4_ < 0.0) {
      fVar7 = sqrtf(auVar9._0_4_);
      auVar6 = ZEXT416(auVar6._0_4_);
    }
    else {
      auVar9 = vsqrtss_avx(auVar9,auVar9);
      fVar7 = auVar9._0_4_;
    }
    fVar7 = auVar6._0_4_ / (fVar7 + fVar7) + 0.5;
  }
  auVar6 = vfmadd213ss_fma(ZEXT416((uint)this->c0),SUB6416(ZEXT464(0x444f8000),0),
                           ZEXT416((uint)this->c1));
  auVar6 = vfmadd213ss_fma(auVar6,SUB6416(ZEXT464(0x444f8000),0),ZEXT416((uint)this->c2));
  if ((auVar6._0_4_ & 0x7fffffff) == 0x7f800000) {
    uVar1 = vcmpss_avx512f(ZEXT816(0),auVar6,1);
    fVar8 = (float)((uint)((byte)uVar1 & 1) * 0x3f800000);
  }
  else {
    auVar9 = vfmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar6,auVar6);
    if (auVar9._0_4_ < 0.0) {
      fVar8 = sqrtf(auVar9._0_4_);
      auVar6 = ZEXT416(auVar6._0_4_);
    }
    else {
      auVar9 = vsqrtss_avx(auVar9,auVar9);
      fVar8 = auVar9._0_4_;
    }
    fVar8 = auVar6._0_4_ / (fVar8 + fVar8) + 0.5;
  }
  auVar6 = vmaxss_avx(ZEXT416((uint)fVar8),ZEXT416((uint)fVar7));
  return auVar6._0_4_;
}

Assistant:

PBRT_CPU_GPU
    Float MaxValue() const {
        if (c0 < 0) {
            Float lambda = -c1 / (2 * c0);
            if (lambda >= 360 && lambda <= 830)
                return std::max({(*this)(lambda), (*this)(360), (*this)(830)});
        }
        return std::max((*this)(360), (*this)(830));
    }